

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ipc::BufferedFrameDeserializer::DecodeFrame
          (BufferedFrameDeserializer *this,char *data,size_t size)

{
  int iVar1;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_*,_false> this_00;
  pointer *__ptr;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_*,_false> local_28;
  
  if (size != 0) {
    this_00._M_head_impl = (IPCFrame *)operator_new(0x78);
    protos::gen::IPCFrame::IPCFrame(this_00._M_head_impl);
    local_28._M_head_impl = this_00._M_head_impl;
    iVar1 = (*((this_00._M_head_impl)->super_CppMessageObj)._vptr_CppMessageObj[4])
                      (this_00._M_head_impl,data,size);
    if (((char)iVar1 != '\0') &&
       (std::__cxx11::
        list<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
        ::push_back(&this->decoded_frames_,(value_type *)&local_28),
       this_00._M_head_impl = local_28._M_head_impl, local_28._M_head_impl == (IPCFrame *)0x0)) {
      return;
    }
    (*((this_00._M_head_impl)->super_CppMessageObj)._vptr_CppMessageObj[1])(this_00._M_head_impl);
  }
  return;
}

Assistant:

void BufferedFrameDeserializer::DecodeFrame(const char* data, size_t size) {
  if (size == 0)
    return;
  std::unique_ptr<Frame> frame(new Frame);
  if (frame->ParseFromArray(data, size))
    decoded_frames_.push_back(std::move(frame));
}